

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::Equal(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  BOOL BVar6;
  int iVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  char16 *__s2;
  
  if (aLeft == aRight) {
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (bVar3) {
        *puVar9 = 0;
        return 1;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      return 1;
    }
    bVar3 = DynamicObject::IsBaseDynamicObject(aLeft);
    if (bVar3) {
      return 1;
    }
  }
  else {
    bVar3 = VarIs<Js::JavascriptString>(aLeft);
    if ((bVar3) && (bVar3 = VarIs<Js::JavascriptString>(aRight), bVar3)) {
      cVar4 = JavascriptString::GetLength((JavascriptString *)aLeft);
      cVar5 = JavascriptString::GetLength((JavascriptString *)aRight);
      if (cVar4 != cVar5) {
        return 0;
      }
      pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aLeft);
      if ((pcVar8 != (char16 *)0x0) &&
         (pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight),
         pcVar8 != (char16 *)0x0)) {
        cVar4 = JavascriptString::GetLength((JavascriptString *)aLeft);
        pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aLeft);
        if (cVar4 == 1) {
          cVar1 = *pcVar8;
          pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight);
          bVar3 = cVar1 == *pcVar8;
        }
        else {
          __s2 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight);
          cVar4 = JavascriptString::GetLength((JavascriptString *)aLeft);
          iVar7 = bcmp(pcVar8,__s2,(ulong)cVar4 * 2);
          bVar3 = iVar7 == 0;
        }
        return (uint)bVar3;
      }
    }
  }
  BVar6 = Equal_Full(aLeft,aRight,scriptContext);
  return BVar6;
}

Assistant:

BOOL JavascriptOperators::Equal(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_Equal);
        JIT_HELPER_SAME_ATTRIBUTES(Op_Equal, Op_Equal_Full);
        if (aLeft == aRight)
        {
            if (TaggedInt::Is(aLeft) || DynamicObject::IsBaseDynamicObject(aLeft))
            {
                return true;
            }
            else
            {
                return Equal_Full(aLeft, aRight, scriptContext);
            }
        }

        if (VarIs<JavascriptString>(aLeft) && VarIs<JavascriptString>(aRight))
        {
            JavascriptString* left = (JavascriptString*)aLeft;
            JavascriptString* right = (JavascriptString*)aRight;

            if (left->GetLength() == right->GetLength())
            {
                if (left->UnsafeGetBuffer() != NULL && right->UnsafeGetBuffer() != NULL)
                {
                    if (left->GetLength() == 1)
                    {
                        return left->UnsafeGetBuffer()[0] == right->UnsafeGetBuffer()[0];
                    }
                    return memcmp(left->UnsafeGetBuffer(), right->UnsafeGetBuffer(), left->GetLength() * sizeof(left->UnsafeGetBuffer()[0])) == 0;
                }
                // fall through to Equal_Full
            }
            else
            {
                return false;
            }
        }

        return Equal_Full(aLeft, aRight, scriptContext);
        JIT_HELPER_END(Op_Equal);
    }